

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

void __thiscall Rml::DataModel::DataModel(DataModel *this,DataTypeRegister *data_type_register)

{
  unique_ptr<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_> local_38;
  unique_ptr<Rml::DataViews,_std::default_delete<Rml::DataViews>_> local_30 [3];
  DataTypeRegister *local_18;
  DataTypeRegister *data_type_register_local;
  DataModel *this_local;
  
  local_18 = data_type_register;
  data_type_register_local = (DataTypeRegister *)this;
  NonCopyMoveable::NonCopyMoveable((NonCopyMoveable *)this);
  ::std::unique_ptr<Rml::DataViews,std::default_delete<Rml::DataViews>>::
  unique_ptr<std::default_delete<Rml::DataViews>,void>
            ((unique_ptr<Rml::DataViews,std::default_delete<Rml::DataViews>> *)this);
  ::std::unique_ptr<Rml::DataControllers,std::default_delete<Rml::DataControllers>>::
  unique_ptr<std::default_delete<Rml::DataControllers>,void>
            ((unique_ptr<Rml::DataControllers,std::default_delete<Rml::DataControllers>> *)
             &this->controllers);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->variables);
  itlib::
  flat_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_itlib::fsimpl::less,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::flat_set(&this->dirty_variables);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FuncDefinition,_std::default_delete<Rml::FuncDefinition>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->function_variable_definitions);
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Rml::DataModelHandle,_Rml::Event_&,_const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Table(&this->event_callbacks);
  robin_hood::detail::
  Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
  ::Table(&this->aliases);
  this->data_type_register = local_18;
  itlib::
  flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  ::flat_set(&this->attached_elements);
  MakeUnique<Rml::DataViews>();
  ::std::unique_ptr<Rml::DataViews,_std::default_delete<Rml::DataViews>_>::operator=
            (&this->views,local_30);
  ::std::unique_ptr<Rml::DataViews,_std::default_delete<Rml::DataViews>_>::~unique_ptr(local_30);
  MakeUnique<Rml::DataControllers>();
  ::std::unique_ptr<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_>::operator=
            (&this->controllers,&local_38);
  ::std::unique_ptr<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_>::~unique_ptr
            (&local_38);
  return;
}

Assistant:

DataModel::DataModel(DataTypeRegister* data_type_register) : data_type_register(data_type_register)
{
	views = MakeUnique<DataViews>();
	controllers = MakeUnique<DataControllers>();
}